

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::~Client(Client *this)

{
  Client *this_local;
  
  close(this->sockfd);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Client::~Client()
{
    close(sockfd);
}